

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextGenerator.cpp
# Opt level: O2

void __thiscall TextGenerator::generate(TextGenerator *this,ostream *output,ScName *stmName)

{
  ScModel *pSVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  ScName local_50;
  
  pSVar1 = (this->super_AbstractGenerator).m_model;
  if (stmName->_M_string_length != 0) {
    std::operator<<(output,"Note: discarding a state-machine name\n");
  }
  for (p_Var5 = (pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    poVar2 = std::operator<<(output,"Name: ");
    hlText(&local_50,this,(ScName *)(p_Var5 + 1));
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_50);
    poVar2 = std::operator<<(output,"Parent: ");
    hlText(&local_50,this,(ScName *)(p_Var5 + 2));
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_50);
    uVar8 = 0;
    while( true ) {
      if ((ulong)(((long)p_Var5[4]._M_left - (long)p_Var5[4]._M_parent) / 0x50) <= uVar8) break;
      poVar2 = std::operator<<(output,"Substates (");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,") [");
      lVar7 = uVar8 * 0x50;
      poVar2 = std::operator<<(poVar2,(string *)((long)p_Var5[4]._M_parent + lVar7));
      std::operator<<(poVar2,"]:\n");
      p_Var4 = p_Var5[4]._M_parent;
      for (p_Var3 = *(_Rb_tree_node_base **)((long)p_Var4 + lVar7 + 0x38);
          p_Var3 != (_Rb_tree_node_base *)((long)p_Var4 + lVar7 + 0x28);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        poVar2 = std::operator<<(output,"    ");
        hlText(&local_50,this,(ScName *)(p_Var3 + 1));
        poVar2 = std::operator<<(poVar2,(string *)&local_50);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_50);
      }
      uVar8 = uVar8 + 1;
    }
    if (p_Var5[6]._M_parent != (_Base_ptr)0x0) {
      std::operator<<(output,"Transitions:\n");
      for (p_Var4 = p_Var5[5]._M_right; p_Var4 != (_Base_ptr)&p_Var5[5]._M_parent;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        poVar2 = std::operator<<(output,"==> ");
        hlText(&local_50,this,(ScName *)(p_Var4 + 1));
        poVar2 = std::operator<<(poVar2,(string *)&local_50);
        pcVar6 = " (history)\n";
        if (p_Var4[2]._M_color == _S_red) {
          pcVar6 = "\n";
        }
        std::operator<<(poVar2,pcVar6);
        std::__cxx11::string::~string((string *)&local_50);
        for (p_Var3 = *(_Rb_tree_node_base **)(p_Var4 + 3);
            p_Var3 != (_Rb_tree_node_base *)&p_Var4[2]._M_left;
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
          poVar2 = std::operator<<(output,"    ** ");
          hlText(&local_50,this,(ScName *)(p_Var3 + 1));
          poVar2 = std::operator<<(poVar2,(string *)&local_50);
          std::operator<<(poVar2,"\n");
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
    if (p_Var5[7]._M_right != (_Base_ptr)0x0) {
      std::operator<<(output,"Deferrals:\n");
      for (p_Var4 = p_Var5[7]._M_parent; p_Var4 != (_Base_ptr)&p_Var5[6]._M_right;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        poVar2 = std::operator<<(output,"    ");
        hlText(&local_50,this,(ScName *)(p_Var4 + 1));
        poVar2 = std::operator<<(poVar2,(string *)&local_50);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    std::operator<<(output,"\n");
  }
  std::ostream::flush();
  return;
}

Assistant:

void TextGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &states = m_model.states();

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    for (const auto &[name, state] : states) {
        output << "Name: " << hlText(name) << "\n";
        output << "Parent: " << hlText(state.parent) << "\n";
        for (ScRegionNum i = 0; i < state.regions.size(); i++) {
            output << "Substates (" << i << ") [" << state.regions[i].initial << "]:\n";
            for (const auto &substate : state.regions[i].states) {
                output << "    " << hlText(substate) << "\n";
            }
        }
        if (!state.transitions.empty()) {
            output << "Transitions:\n";
            for (const auto &[target, events] : state.transitions) {
                output << "==> " << hlText(target.name)
                       << (target.historyMode != ScHistoryMode::None ? " (history)\n" : "\n");
                for (const auto &event : events) {
                    output << "    ** " << hlText(event) << "\n";
                }
            }
        }
        if (!state.deferrals.empty()) {
            output << "Deferrals:\n";
            for (const auto &event : state.deferrals) {
                output << "    " << hlText(event) << "\n";
            }
        }
        output << "\n";
    }

    output.flush();
}